

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall antlr::CharScanner::traceIn(CharScanner *this,char *rname)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  char *in_RSI;
  long *in_RDI;
  
  *(int *)(in_RDI + 0x11) = (int)in_RDI[0x11] + 1;
  (**(code **)(*in_RDI + 0x178))();
  poVar2 = std::operator<<((ostream *)&std::cout,"> lexer ");
  poVar2 = std::operator<<(poVar2,in_RSI);
  poVar2 = std::operator<<(poVar2,"; c==");
  iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,1);
  this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CharScanner::traceIn(const char* rname)
{
	traceDepth++;
	traceIndent();
	ANTLR_USE_NAMESPACE(std)cout << "> lexer " << rname
		<< "; c==" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
}